

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::write_int<unsigned_int,fmt::v5::basic_format_specs<char>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,uint value,basic_format_specs<char> *spec)

{
  byte bVar1;
  int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_> local_20;
  
  local_20.prefix_size = 0;
  bVar1 = (spec->super_core_format_specs).flags;
  if ((bVar1 & 1) != 0) {
    local_20.prefix[0] = '+';
    if ((bVar1 & 2) == 0) {
      local_20.prefix[0] = ' ';
    }
    local_20.prefix_size = 1;
  }
  local_20.writer =
       (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
        *)this;
  local_20.spec = spec;
  local_20.abs_value = value;
  internal::
  handle_int_type_spec<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>>
            ((spec->super_core_format_specs).type,&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type,
                                   int_writer<T, Spec>(*this, value, spec));
  }